

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall UtestShell::runOneTest(UtestShell *this,TestPlugin *plugin,TestResult *result)

{
  uint uVar1;
  TestResult *in_RDX;
  TestPlugin *in_RSI;
  UtestShell *in_RDI;
  HelperTestRunInfo runInfo;
  HelperTestRunInfo local_30;
  TestResult *local_18;
  TestPlugin *local_10;
  
  in_RDI->hasFailed_ = false;
  local_18 = in_RDX;
  local_10 = in_RSI;
  (*in_RDX->_vptr_TestResult[9])();
  HelperTestRunInfo::HelperTestRunInfo(&local_30,in_RDI,local_10,local_18);
  uVar1 = (*in_RDI->_vptr_UtestShell[0x1f])();
  if ((uVar1 & 1) == 0) {
    (*PlatformSpecificSetJmp)(helperDoRunOneTestInCurrentProcess,&local_30);
  }
  else {
    (*PlatformSpecificSetJmp)(helperDoRunOneTestSeperateProcess,&local_30);
  }
  return;
}

Assistant:

void UtestShell::runOneTest(TestPlugin* plugin, TestResult& result)
{
    hasFailed_ = false;
    result.countRun();
    HelperTestRunInfo runInfo(this, plugin, &result);
    if (isRunInSeperateProcess())
        PlatformSpecificSetJmp(helperDoRunOneTestSeperateProcess, &runInfo);
    else
        PlatformSpecificSetJmp(helperDoRunOneTestInCurrentProcess, &runInfo);
}